

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O1

void __thiscall HDual::major_chooseRow(HDual *this)

{
  MChoice *pMVar1;
  double dVar2;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  HDualRHS *pHVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  MChoice *pMVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int *chIndex;
  uint uVar18;
  int iVar20;
  undefined1 auVar19 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  undefined8 uStack_60;
  int aiStack_58 [2];
  long local_50;
  long local_48;
  HDualRHS *local_40;
  uint local_34 [2];
  int initialCount;
  double dVar3;
  
  if (this->model->countUpdate == 0) {
    this->multi_chooseAgain = 1;
  }
  if (this->multi_chooseAgain == 0) {
    return;
  }
  this->multi_chooseAgain = 0;
  this->multi_iteration = this->multi_iteration + 1;
  local_40 = &this->dualRHS;
  pMVar1 = this->multi_choice;
  local_50 = 1;
  local_48 = 3;
  while( true ) {
    pHVar9 = local_40;
    local_34[0] = 0;
    lVar12 = -((ulong)(uint)this->multi_num * 4 + 0xf & 0xfffffffffffffff0);
    chIndex = (int *)((long)aiStack_58 + lVar12);
    iVar11 = this->multi_num;
    *(undefined8 *)((long)&uStack_60 + lVar12) = 0x11cdc0;
    HDualRHS::choose_multi_HGauto(pHVar9,chIndex,(int *)local_34,iVar11);
    uVar10 = local_34[0];
    auVar24 = _DAT_001570a0;
    uVar14 = (ulong)local_34[0];
    dVar21 = (this->dualRHS).workCutoff;
    if (((uVar14 == 0) && (dVar21 == 0.0)) && (!NAN(dVar21))) {
      (*(code *)((long)&switchD_0011d0da::switchdataD_00157af0 +
                (long)(int)(&switchD_0011d0da::switchdataD_00157af0)[local_50]))();
      return;
    }
    if ((int)local_34[0] < 1) {
      uVar18 = 0;
    }
    else {
      pdVar4 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar5 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = 0;
      uVar18 = 0;
      do {
        iVar11 = chIndex[uVar15];
        if (dVar21 <= pdVar4[iVar11] / pdVar5[iVar11]) {
          lVar17 = (long)(int)uVar18;
          uVar18 = uVar18 + 1;
          chIndex[lVar17] = iVar11;
        }
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    pHVar9 = local_40;
    if ((uVar14 == 0) || ((int)uVar18 <= (int)uVar10 / 3)) break;
    iVar11 = this->multi_num;
    if (0 < (long)iVar11) {
      lVar17 = (long)iVar11 + -1;
      auVar19._8_4_ = (int)lVar17;
      auVar19._0_8_ = lVar17;
      auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar19 = auVar19 ^ _DAT_001570a0;
      lVar17 = 0;
      auVar23 = _DAT_00157090;
      auVar25 = _DAT_001570e0;
      do {
        auVar26 = auVar23 ^ auVar24;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar20 && auVar19._0_4_ < auVar26._0_4_ ||
                    iVar20 < auVar26._4_4_) & 1)) {
          *(undefined4 *)((long)&this->multi_choice[0].rowOut + lVar17) = 0xffffffff;
        }
        if ((auVar26._12_4_ != auVar19._12_4_ || auVar26._8_4_ <= auVar19._8_4_) &&
            auVar26._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)&this->multi_choice[1].rowOut + lVar17) = 0xffffffff;
        }
        auVar26 = auVar25 ^ auVar24;
        iVar27 = auVar26._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar26._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)&this->multi_choice[2].rowOut + lVar17) = 0xffffffff;
          *(undefined4 *)((long)&this->multi_choice[3].rowOut + lVar17) = 0xffffffff;
        }
        lVar16 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 4;
        auVar23._8_8_ = lVar16 + 4;
        lVar16 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 4;
        auVar25._8_8_ = lVar16 + 4;
        lVar17 = lVar17 + 0x980;
      } while ((ulong)(iVar11 + 3U >> 2) * 0x980 - lVar17 != 0);
    }
    if (0 < (int)uVar18) {
      uVar14 = 0;
      pMVar13 = pMVar1;
      do {
        pMVar13->rowOut = chIndex[uVar14];
        uVar14 = uVar14 + 1;
        pMVar13 = pMVar13 + 1;
      } while (uVar18 != uVar14);
    }
    *(undefined8 *)((long)&uStack_60 + lVar12) = 0x11cf9f;
    major_chooseRowBtran(this);
    lVar12 = (long)this->multi_num;
    if (0 < lVar12) {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = this->row_epDensity;
      lVar17 = 0;
      do {
        if (-1 < *(int *)((long)&this->multi_choice[0].rowOut + lVar17)) {
          dVar21 = auVar24._0_8_ * 0.95;
          this->row_epDensity = dVar21;
          auVar24._0_8_ =
               dVar21 + ((double)*(int *)((long)&this->multi_choice[0].row_ep.count + lVar17) * 0.05
                        ) / (double)this->numRow;
          this->row_epDensity = auVar24._0_8_;
        }
        lVar17 = lVar17 + 0x260;
      } while (lVar12 * 0x260 - lVar17 != 0);
    }
    if (this->multi_num < 1) {
      iVar11 = 0;
    }
    else {
      pdVar4 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = 0;
      iVar11 = 0;
      do {
        lVar16 = (long)*(int *)((long)&pMVar1->rowOut + lVar17);
        if ((-1 < lVar16) &&
           (dVar21 = *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar17),
           dVar22 = dVar21 * 0.25, pdVar6 = pdVar4 + lVar16, dVar2 = *pdVar6, dVar3 = *pdVar6,
           pdVar4[lVar16] = dVar21, dVar3 <= dVar22 && dVar22 != dVar2)) {
          *(undefined4 *)((long)&pMVar1->rowOut + lVar17) = 0xffffffff;
          iVar11 = iVar11 + 1;
        }
        lVar17 = lVar17 + 0x260;
      } while (lVar12 * 0x260 - lVar17 != 0);
    }
    switch(iVar11 <= (int)uVar18 / 3) {
    case true:
      iVar11 = this->multi_num;
      if (0 < (long)iVar11) {
        dVar21 = this->model->dblOption[4];
        pdVar6 = this->baseValue;
        pdVar7 = this->baseLower;
        pdVar8 = this->baseUpper;
        pdVar4 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar12 = 0;
        do {
          lVar17 = (long)*(int *)((long)&this->multi_choice[0].rowOut + lVar12);
          if (-1 < lVar17) {
            *(double *)((long)&this->multi_choice[0].baseValue + lVar12) = pdVar6[lVar17];
            *(double *)((long)&this->multi_choice[0].baseLower + lVar12) = pdVar7[lVar17];
            *(double *)((long)&this->multi_choice[0].baseUpper + lVar12) = pdVar8[lVar17];
            *(double *)((long)&this->multi_choice[0].infeasValue + lVar12) = pdVar4[lVar17];
            *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar12) = pdVar5[lVar17];
            *(double *)((long)&this->multi_choice[0].infeasLimit + lVar12) =
                 (pdVar4[lVar17] / pdVar5[lVar17]) * dVar21;
          }
          lVar12 = lVar12 + 0x260;
        } while ((long)iVar11 * 0x260 - lVar12 != 0);
      }
      this->multi_nFinish = 0;
      return;
    }
  }
  dVar21 = this->columnDensity;
  *(undefined8 *)((long)&uStack_60 + lVar12) = 0x11d08a;
  HDualRHS::create_infeasList(pHVar9,dVar21);
  (*(code *)((long)&switchD_0011d0da::switchdataD_00157af0 +
            (long)(int)(&switchD_0011d0da::switchdataD_00157af0)[local_48]))();
  return;
}

Assistant:

void HDual::major_chooseRow() {

    /**
     * 0. Initial check to see if we need to do it again
     */
    if (model->countUpdate == 0)
        multi_chooseAgain = 1;
    if (!multi_chooseAgain)
        return;
    multi_chooseAgain = 0;
    multi_iteration++;

    /**
     * Major loop:
     *     repeat 1-5, until we found a good sets of choices
     */
    for (;;) {
        // 1. Multiple CHUZR
        int initialCount = 0;
        int choiceIndex[multi_num];
        dualRHS.choose_multi_HGauto(&choiceIndex[0], &initialCount, multi_num);
//        dualRHS.choose_multi_global(&choiceIndex[0], &initialCount, multi_num);
        if (initialCount == 0 && dualRHS.workCutoff == 0) {
            // OPTIMAL
            return;
        }

        // 2. Shrink the size by cutoff
        int choiceCount = 0;
        for (int i = 0; i < initialCount; i++) {
            int iRow = choiceIndex[i];
            if (dualRHS.workArray[iRow] / dualRHS.workEdWt[iRow]
                    >= dualRHS.workCutoff) {
                choiceIndex[choiceCount++] = iRow;
            }
        }
        if (initialCount == 0 || choiceCount <= initialCount / 3) {
            // Need to do the list again
            dualRHS.create_infeasList(columnDensity);
            continue;
        }

        // 3. Store the choiceIndex to buffer
        for (int ich = 0; ich < multi_num; ich++)
            multi_choice[ich].rowOut = -1;
        for (int ich = 0; ich < choiceCount; ich++)
            multi_choice[ich].rowOut = choiceIndex[ich];

        // 4. Parallel BTRAN and compute weight
        major_chooseRowBtran();

        // 5. Update row weights
        for (int ich = 0; ich < multi_num; ich++) {
            if (multi_choice[ich].rowOut >= 0) {
                row_epDensity *= 0.95;
                row_epDensity += 0.05 * multi_choice[ich].row_ep.count / numRow;
            }
        }

        // 6. Check updated and computed weight
        int countWrongEdWt = 0;
        for (int i = 0; i < multi_num; i++) {
            const int iRow = multi_choice[i].rowOut;
            if (iRow < 0)
                continue;
            double u_weight = dualRHS.workEdWt[iRow];
            double c_weight = dualRHS.workEdWt[iRow] =
                    multi_choice[i].infeasEdWt;
            if (u_weight < 0.25 * c_weight) {
                multi_choice[i].rowOut = -1;
                countWrongEdWt++;
            }
        }
        if (countWrongEdWt <= choiceCount / 3)
            break;
    }

    // 6. Take other info associated with choices
    double pamiCutoff = model->dblOption[DBLOPT_PAMI_CUTOFF];
    for (int i = 0; i < multi_num; i++) {
        const int iRow = multi_choice[i].rowOut;
        if (iRow < 0)
            continue;
        // Other info
        multi_choice[i].baseValue = baseValue[iRow];
        multi_choice[i].baseLower = baseLower[iRow];
        multi_choice[i].baseUpper = baseUpper[iRow];
        multi_choice[i].infeasValue = dualRHS.workArray[iRow];
        multi_choice[i].infeasEdWt = dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit = dualRHS.workArray[iRow]
                / dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit *= pamiCutoff;
    }

    // 6. Finish count
    multi_nFinish = 0;
}